

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

ARKodeMem arkCreate(SUNContext sunctx)

{
  int iVar1;
  ARKodeMem arkode_mem;
  ARKodeHAdaptMem pAVar2;
  char *module;
  char *msgfmt;
  
  if (sunctx == (SUNContext)0x0) {
    module = "ARKODE";
    msgfmt = "sunctx = NULL illegal.";
    iVar1 = -0x16;
  }
  else {
    arkode_mem = (ARKodeMem)calloc(1,0x2a8);
    if (arkode_mem == (ARKodeMem)0x0) {
      msgfmt = "Allocation of arkode_mem failed.";
    }
    else {
      arkode_mem->sunctx = sunctx;
      arkode_mem->uround = 2.220446049250313e-16;
      arkode_mem->lrw = 0x12;
      arkode_mem->liw = 0x27;
      pAVar2 = arkAdaptInit();
      arkode_mem->hadapt_mem = pAVar2;
      if (pAVar2 != (ARKodeHAdaptMem)0x0) {
        arkode_mem->lrw = 0x25;
        arkode_mem->liw = 0x2f;
        arkode_mem->interp = (ARKInterp)0x0;
        arkode_mem->rwt_is_ewt = 1;
        arkode_mem->call_fullrhs = 0;
        arkode_mem->initsetup = 1;
        arkode_mem->init_type = 0;
        arkode_mem->firststage = 1;
        arkode_mem->initialized = 0;
        arkode_mem->h = 0.0;
        arkode_mem->h0u = 0.0;
        iVar1 = arkSetDefaults(arkode_mem);
        if (iVar1 == 0) {
          return arkode_mem;
        }
        module = "ARKode";
        msgfmt = "Error setting default solver options";
        iVar1 = 0;
        goto LAB_004b45cf;
      }
      msgfmt = "Allocation of step adaptivity structure failed";
    }
    module = "ARKode";
    iVar1 = -0x14;
  }
LAB_004b45cf:
  arkProcessError((ARKodeMem)0x0,iVar1,module,"arkCreate",msgfmt);
  return (ARKodeMem)0x0;
}

Assistant:

ARKodeMem arkCreate(SUNContext sunctx)
{
  int iret;
  ARKodeMem ark_mem;

  if (!sunctx) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKODE", "arkCreate",
                    MSG_ARK_NULL_SUNCTX);
    return(NULL);
  }

  ark_mem = NULL;
  ark_mem = (ARKodeMem) malloc(sizeof(struct ARKodeMemRec));
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode", "arkCreate",
                    MSG_ARK_ARKMEM_FAIL);
    return(NULL);
  }

  /* Zero out ark_mem */
  memset(ark_mem, 0, sizeof(struct ARKodeMemRec));

  /* Set the context */
  ark_mem->sunctx = sunctx;

  /* Set uround */
  ark_mem->uround = UNIT_ROUNDOFF;

  /* Initialize time step module to NULL */
  ark_mem->step_attachlinsol   = NULL;
  ark_mem->step_attachmasssol  = NULL;
  ark_mem->step_disablelsetup  = NULL;
  ark_mem->step_disablemsetup  = NULL;
  ark_mem->step_getlinmem      = NULL;
  ark_mem->step_getmassmem     = NULL;
  ark_mem->step_getimplicitrhs = NULL;
  ark_mem->step_mmult          = NULL;
  ark_mem->step_getgammas      = NULL;
  ark_mem->step_init           = NULL;
  ark_mem->step_fullrhs        = NULL;
  ark_mem->step                = NULL;
  ark_mem->step_mem            = NULL;

  /* Initialize root finding variables */
  ark_mem->root_mem = NULL;

  /* Initialize inequality constraints variables */
  ark_mem->constraintsSet = SUNFALSE;
  ark_mem->constraints    = NULL;

  /* Initialize diagnostics reporting variables */
  ark_mem->report  = SUNFALSE;
  ark_mem->diagfp  = NULL;

  /* Initialize lrw and liw */
  ark_mem->lrw = 18;
  ark_mem->liw = 39;  /* fcn/data ptr, int, long int, sunindextype, booleantype */

  /* No mallocs have been done yet */
  ark_mem->VabstolMallocDone     = SUNFALSE;
  ark_mem->VRabstolMallocDone    = SUNFALSE;
  ark_mem->MallocDone            = SUNFALSE;

  /* No user-supplied step postprocessing function yet */
  ark_mem->ProcessStep  = NULL;
  ark_mem->ps_data      = NULL;

  /* No user-supplied stage postprocessing function yet */
  ark_mem->ProcessStage = NULL;

  /* No user_data pointer yet */
  ark_mem->user_data = NULL;

  /* Allocate step adaptivity structure and note storage */
  ark_mem->hadapt_mem = arkAdaptInit();
  if (ark_mem->hadapt_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_FAIL, "ARKode", "arkCreate",
                    "Allocation of step adaptivity structure failed");
    return(NULL);
  }
  ark_mem->lrw += ARK_ADAPT_LRW;
  ark_mem->liw += ARK_ADAPT_LIW;

  /* Initialize the interpolation structure to NULL */
  ark_mem->interp = NULL;

  /* Initially, rwt should point to ewt */
  ark_mem->rwt_is_ewt = SUNTRUE;

  /* Indicate that evaluation of the full RHS is not required after each step,
     this flag is updated to SUNTRUE by the interpolation module initialization
     function and/or the stepper initialization function in arkInitialSetup */
  ark_mem->call_fullrhs = SUNFALSE;

  /* Indicate that the problem needs to be initialized */
  ark_mem->initsetup   = SUNTRUE;
  ark_mem->init_type   = FIRST_INIT;
  ark_mem->firststage  = SUNTRUE;
  ark_mem->initialized = SUNFALSE;

  /* Initial step size has not been determined yet */
  ark_mem->h   = ZERO;
  ark_mem->h0u = ZERO;

  /* Set default values for integrator optional inputs */
  iret = arkSetDefaults(ark_mem);
  if (iret != ARK_SUCCESS) {
    arkProcessError(NULL, 0, "ARKode", "arkCreate",
                    "Error setting default solver options");
    return(NULL);
  }

  /* Return pointer to ARKode memory block */
  return(ark_mem);
}